

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool __thiscall
PartiallySignedTransaction::Merge(PartiallySignedTransaction *this,PartiallySignedTransaction *psbt)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  reference ppVar4;
  size_type sVar5;
  PSBTOutput *in_RDI;
  long in_FS_OFFSET;
  PSBTInput *unaff_retaddr;
  PSBTInput *in_stack_00000008;
  pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>
  *xpub_pair;
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *__range1;
  uint i_1;
  uint i;
  const_iterator __end1;
  const_iterator __begin1;
  optional<CMutableTransaction> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *in_stack_ffffffffffffff18;
  _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_stack_ffffffffffffff20;
  _Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  in_stack_ffffffffffffff28;
  reference in_stack_ffffffffffffff30;
  PSBTOutput *in_stack_ffffffffffffff58;
  uint local_78;
  uint local_74;
  bool local_59;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<CMutableTransaction>::operator->(in_stack_ffffffffffffff08);
  CMutableTransaction::GetHash((CMutableTransaction *)in_stack_ffffffffffffff28._M_node);
  std::optional<CMutableTransaction>::operator->(in_stack_ffffffffffffff08);
  CMutableTransaction::GetHash((CMutableTransaction *)in_stack_ffffffffffffff28._M_node);
  bVar2 = transaction_identifier<false>::operator!=
                    ((transaction_identifier<false> *)in_stack_ffffffffffffff18,
                     (transaction_identifier<false> *)
                     CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  if (bVar2) {
    local_59 = false;
  }
  else {
    local_74 = 0;
    while( true ) {
      sVar3 = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::size
                        ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_ffffffffffffff08)
      ;
      if (sVar3 <= local_74) break;
      std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator[]
                ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_ffffffffffffff18,
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator[]
                ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_ffffffffffffff18,
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      PSBTInput::Merge(in_stack_00000008,unaff_retaddr);
      local_74 = local_74 + 1;
    }
    local_78 = 0;
    while( true ) {
      sVar3 = std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::size
                        ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)
                         in_stack_ffffffffffffff08);
      if (sVar3 <= local_78) break;
      in_stack_ffffffffffffff30 =
           std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::operator[]
                     ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_stack_ffffffffffffff18,
                      CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::operator[]
                ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_stack_ffffffffffffff18,
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      PSBTOutput::Merge(in_stack_ffffffffffffff58,in_RDI);
      local_78 = local_78 + 1;
    }
    std::
    map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
    ::begin((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::
    map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
    ::end((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    while( true ) {
      bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff18,
                              (_Self *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                             );
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
                            *)in_stack_ffffffffffffff08);
      sVar5 = std::
              map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
              ::count(in_stack_ffffffffffffff18,
                      (key_type *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      if (sVar5 == 0) {
        in_stack_ffffffffffffff28._M_node = (_Base_ptr)&ppVar4->second;
        std::
        map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
        ::operator[]((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                      *)in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28._M_node);
        std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::operator=
                  ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                   in_stack_ffffffffffffff18,
                   (set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      }
      else {
        in_stack_ffffffffffffff20._M_node =
             (_Base_ptr)
             std::
             map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
             ::operator[]((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                           *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28._M_node);
        std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::begin
                  ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>::end
                  ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        std::set<CExtPubKey,std::less<CExtPubKey>,std::allocator<CExtPubKey>>::
        insert<std::_Rb_tree_const_iterator<CExtPubKey>>
                  ((set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *)
                   in_stack_ffffffffffffff08,
                   (_Rb_tree_const_iterator<CExtPubKey>)in_stack_ffffffffffffff28._M_node,
                   (_Rb_tree_const_iterator<CExtPubKey>)in_stack_ffffffffffffff20._M_node);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>
                    *)in_stack_ffffffffffffff08);
    }
    std::
    map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::begin((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::
    map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::end((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::
    map<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
    ::
    insert<std::_Rb_tree_const_iterator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    local_59 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::Merge(const PartiallySignedTransaction& psbt)
{
    // Prohibited to merge two PSBTs over different transactions
    if (tx->GetHash() != psbt.tx->GetHash()) {
        return false;
    }

    for (unsigned int i = 0; i < inputs.size(); ++i) {
        inputs[i].Merge(psbt.inputs[i]);
    }
    for (unsigned int i = 0; i < outputs.size(); ++i) {
        outputs[i].Merge(psbt.outputs[i]);
    }
    for (auto& xpub_pair : psbt.m_xpubs) {
        if (m_xpubs.count(xpub_pair.first) == 0) {
            m_xpubs[xpub_pair.first] = xpub_pair.second;
        } else {
            m_xpubs[xpub_pair.first].insert(xpub_pair.second.begin(), xpub_pair.second.end());
        }
    }
    unknown.insert(psbt.unknown.begin(), psbt.unknown.end());

    return true;
}